

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData
          (FunctionBody *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionBody *inlinee)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  Recycler *pRVar7;
  FunctionCodeGenRuntimeData **ppFVar8;
  FunctionCodeGenRuntimeData *this_00;
  WriteBarrierPtr *this_01;
  TrackAllocData local_a8;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> local_80;
  Type inlineeData;
  Type *codeGenGetSetRuntimeData;
  TrackAllocData local_60;
  FunctionCodeGenRuntimeData **local_38;
  FunctionCodeGenRuntimeData **codeGenRuntimeData;
  FunctionBody *inlinee_local;
  Recycler *pRStack_20;
  InlineCacheIndex inlineCacheIndex_local;
  Recycler *recycler_local;
  FunctionBody *this_local;
  
  codeGenRuntimeData = (FunctionCodeGenRuntimeData **)inlinee;
  inlinee_local._4_4_ = inlineCacheIndex;
  pRStack_20 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa3,"(recycler)","recycler");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar2 = inlinee_local._4_4_;
  uVar4 = GetInlineCacheCount(this);
  if (uVar4 <= uVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa4,"(inlineCacheIndex < this->GetInlineCacheCount())",
                                "inlineCacheIndex < this->GetInlineCacheCount()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (codeGenRuntimeData == (FunctionCodeGenRuntimeData **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1aa5,"(inlinee)","inlinee");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pTVar6 = GetCodeGenGetSetRuntimeData(this);
  pRVar7 = pRStack_20;
  if (pTVar6 == (Type *)0x0) {
    uVar4 = GetInlineCacheCount(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&FunctionCodeGenRuntimeData*::typeinfo,0,(ulong)uVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1aa9);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_60);
    uVar4 = GetInlineCacheCount(this);
    local_38 = Memory::AllocateArray<Memory::Recycler,Js::FunctionCodeGenRuntimeData*,false>
                         ((Memory *)pRVar7,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar4);
    SetCodeGenGetSetRuntimeData(this,local_38);
  }
  inlineeData.ptr = (FunctionCodeGenRuntimeData *)GetCodeGenGetSetRuntimeData(this);
  Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::WriteBarrierPtr
            (&local_80,
             (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
             (&(inlineeData.ptr)->functionBody + inlinee_local._4_4_));
  ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                      ((WriteBarrierPtr *)&local_80);
  pRVar7 = pRStack_20;
  if (*ppFVar8 == (FunctionCodeGenRuntimeData *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_a8,(type_info *)&FunctionCodeGenRuntimeData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1ab4);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_a8);
    this_00 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar7,0x43c4b0);
    FunctionCodeGenRuntimeData::FunctionCodeGenRuntimeData
              (this_00,(FunctionBody *)codeGenRuntimeData);
    this_01 = (WriteBarrierPtr *)
              Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::operator=
                        ((WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
                         (&(inlineeData.ptr)->functionBody + inlinee_local._4_4_),this_00);
    ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__(this_01);
    this_local = (FunctionBody *)*ppFVar8;
  }
  else {
    ppFVar8 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)&local_80);
    this_local = (FunctionBody *)*ppFVar8;
  }
  return (FunctionCodeGenRuntimeData *)this_local;
}

Assistant:

FunctionCodeGenRuntimeData *FunctionBody::EnsureLdFldInlineeCodeGenRuntimeData(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(inlineCacheIndex < this->GetInlineCacheCount());
        Assert(inlinee);

        if (this->GetCodeGenGetSetRuntimeData() == nullptr)
        {
            const auto codeGenRuntimeData = RecyclerNewArrayZ(recycler, FunctionCodeGenRuntimeData *, this->GetInlineCacheCount());
            this->SetCodeGenGetSetRuntimeData(codeGenRuntimeData);
        }

        auto codeGenGetSetRuntimeData = this->GetCodeGenGetSetRuntimeData();
        const auto inlineeData = codeGenGetSetRuntimeData[inlineCacheIndex];
        if (inlineeData)
        {
            return inlineeData;
        }

        return codeGenGetSetRuntimeData[inlineCacheIndex] = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
    }